

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O3

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::SetData
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,REAL *R,TPZVec<double> *xc)

{
  this->fR = *R;
  TPZVec<double>::operator=(&this->fxc,xc);
  return;
}

Assistant:

void SetData(const REAL &R, const TPZVec<REAL> &xc)
		{
			fR = R;
			fxc = xc;
#ifdef PZDEBUG
			if (R <= 0) {
				PZError << "R must be positive!\n";
				DebugStop();
			}
			if (xc.NElements() != 3) {
				PZError << "XCenter must have 3 coordinates!\n";
				DebugStop();
			}
#endif
		}